

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SparseLU_Memory.h
# Opt level: O1

int __thiscall
Eigen::internal::SparseLUImpl<double,int>::expand<Eigen::Matrix<double,_1,1,0,_1,1>>
          (SparseLUImpl<double,int> *this,Matrix<double,__1,_1,_0,__1,_1> *vec,int *length,
          int nbElts,int keep_prev,int *num_expansions)

{
  size_t __size;
  double *pdVar1;
  ulong uVar2;
  long lVar3;
  undefined8 *puVar4;
  int iVar5;
  long lVar6;
  uint uVar7;
  ulong uVar8;
  long lVar9;
  int iVar10;
  Index size;
  void *local_40;
  
  iVar10 = *length;
  iVar5 = iVar10;
  if ((keep_prev == 0) && (*num_expansions != 0)) {
    iVar5 = iVar10 + 1;
    if (iVar10 + 1 <= (int)((float)iVar10 * 1.5)) {
      iVar5 = (int)((float)iVar10 * 1.5);
    }
  }
  uVar8 = (ulong)(uint)nbElts;
  if (nbElts < 1) {
    local_40 = (void *)0x0;
    iVar10 = 0;
  }
  else {
    if ((vec->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_rows <
        (long)uVar8) goto LAB_00151461;
    pdVar1 = (vec->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_data;
    __size = uVar8 * 8;
    local_40 = malloc(__size);
    if (local_40 == (void *)0x0) {
      puVar4 = (undefined8 *)__cxa_allocate_exception(8);
      *puVar4 = std::streambuf::xsgetn;
      __cxa_throw(puVar4,&std::bad_alloc::typeinfo,std::bad_alloc::~bad_alloc);
    }
    uVar7 = nbElts & 0x7ffffffe;
    if (nbElts != 1) {
      uVar2 = 2;
      if (2 < (ulong)uVar7) {
        uVar2 = (ulong)uVar7;
      }
      memcpy(local_40,pdVar1,uVar2 * 8);
    }
    iVar10 = nbElts;
    if (uVar7 != nbElts) {
      memcpy((void *)((long)local_40 + (__size & 0x3fffffff0)),
             (void *)((long)pdVar1 + (__size & 0x3fffffff0)),__size & 0x400000008);
    }
  }
  PlainObjectBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::resize
            (&vec->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,(long)iVar5);
  if (0 < nbElts) {
    if ((vec->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_rows <
        (long)uVar8) {
LAB_00151461:
      __assert_fail("a_startRow >= 0 && blockRows >= 0 && a_startRow <= xpr.rows() - blockRows && a_startCol >= 0 && blockCols >= 0 && a_startCol <= xpr.cols() - blockCols"
                    ,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/UI233[P]Denoiser/./Eigen/src/Core/Block.h"
                    ,0x8d,
                    "Eigen::Block<Eigen::Matrix<double, -1, 1>, -1, 1>::Block(XprType &, Index, Index, Index, Index) [XprType = Eigen::Matrix<double, -1, 1>, BlockRows = -1, BlockCols = 1, InnerPanel = false]"
                   );
    }
    if (iVar10 != nbElts) {
      __assert_fail("rows() == other.rows() && cols() == other.cols()",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/UI233[P]Denoiser/./Eigen/src/Core/Assign.h"
                    ,0x1f2,
                    "Derived &Eigen::DenseBase<Eigen::Block<Eigen::Matrix<double, -1, 1>, -1, 1>>::lazyAssign(const DenseBase<OtherDerived> &) [Derived = Eigen::Block<Eigen::Matrix<double, -1, 1>, -1, 1>, OtherDerived = Eigen::Matrix<double, -1, 1>]"
                   );
    }
    pdVar1 = (vec->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_data;
    uVar2 = (ulong)((uint)((ulong)pdVar1 >> 3) & 1);
    if (uVar8 <= uVar2) {
      uVar2 = uVar8;
    }
    if (((ulong)pdVar1 & 7) != 0) {
      uVar2 = uVar8;
    }
    lVar6 = uVar8 - uVar2;
    if (uVar2 != 0) {
      memcpy(pdVar1,local_40,uVar2 * 8);
    }
    lVar9 = (lVar6 - (lVar6 >> 0x3f) & 0xfffffffffffffffeU) + uVar2;
    if (1 < lVar6) {
      lVar3 = uVar2 + 2;
      if ((long)(uVar2 + 2) < lVar9) {
        lVar3 = lVar9;
      }
      memcpy(pdVar1 + uVar2,(void *)((long)local_40 + uVar2 * 8),
             (~uVar2 + lVar3 & 0xfffffffffffffffe) * 8 + 0x10);
    }
    if (lVar9 < (long)uVar8) {
      memcpy(pdVar1 + uVar2 + (lVar6 / 2) * 2,
             (void *)((lVar6 / 2) * 0x10 + uVar2 * 8 + (long)local_40),(uVar8 - lVar9) * 8);
    }
  }
  *length = iVar5;
  if (*num_expansions != 0) {
    *num_expansions = *num_expansions + 1;
  }
  free(local_40);
  return 0;
}

Assistant:

Index  SparseLUImpl<Scalar,Index>::expand(VectorType& vec, Index& length, Index nbElts, Index keep_prev, Index& num_expansions) 
{
  
  float alpha = 1.5; // Ratio of the memory increase 
  Index new_len; // New size of the allocated memory
  
  if(num_expansions == 0 || keep_prev) 
    new_len = length ; // First time allocate requested
  else 
    new_len = (std::max)(length+1,Index(alpha * length));
  
  VectorType old_vec; // Temporary vector to hold the previous values   
  if (nbElts > 0 )
    old_vec = vec.segment(0,nbElts); 
  
  //Allocate or expand the current vector
#ifdef EIGEN_EXCEPTIONS
  try
#endif
  {
    vec.resize(new_len); 
  }
#ifdef EIGEN_EXCEPTIONS
  catch(std::bad_alloc& )
#else
  if(!vec.size())
#endif
  {
    if (!num_expansions)
    {
      // First time to allocate from LUMemInit()
      // Let LUMemInit() deals with it.
      return -1;
    }
    if (keep_prev)
    {
      // In this case, the memory length should not not be reduced
      return new_len;
    }
    else 
    {
      // Reduce the size and increase again 
      Index tries = 0; // Number of attempts
      do 
      {
        alpha = (alpha + 1)/2;
        new_len = (std::max)(length+1,Index(alpha * length));
#ifdef EIGEN_EXCEPTIONS
        try
#endif
        {
          vec.resize(new_len); 
        }
#ifdef EIGEN_EXCEPTIONS
        catch(std::bad_alloc& )
#else
        if (!vec.size())
#endif
        {
          tries += 1; 
          if ( tries > 10) return new_len; 
        }
      } while (!vec.size());
    }
  }
  //Copy the previous values to the newly allocated space 
  if (nbElts > 0)
    vec.segment(0, nbElts) = old_vec;   
   
  
  length  = new_len;
  if(num_expansions) ++num_expansions;
  return 0; 
}